

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

double __thiscall Character::SpellCooldownTime(Character *this)

{
  double dVar1;
  World *pWVar2;
  mapped_type *this_00;
  double dVar3;
  double local_58;
  double cooldown;
  allocator<char> local_39;
  key_type local_38;
  double local_18;
  double cooldown_period;
  Character *this_local;
  
  pWVar2 = this->world;
  cooldown_period = (double)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"SpellCastCooldown",&local_39);
  this_00 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
            ::operator[](&(pWVar2->config).
                          super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         ,&local_38);
  dVar3 = util::variant::operator_cast_to_double(this_00);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  dVar1 = this->spell_fired_time;
  local_18 = dVar3;
  local_58 = Timer::GetTime();
  local_58 = (dVar1 + dVar3) - local_58;
  if (local_58 < 0.0) {
    local_58 = 0.0;
  }
  return local_58;
}

Assistant:

double Character::SpellCooldownTime() const
{
	double cooldown_period = this->world->config["SpellCastCooldown"];
	double cooldown = (this->spell_fired_time + cooldown_period) - Timer::GetTime();

	if (cooldown < 0.0)
		cooldown = 0.0;

	return cooldown;
}